

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dac_control.c
# Opt level: O2

void daccontrol_update(void *info,UINT32 samples,DEV_SMPL **dummy)

{
  undefined1 uVar1;
  ushort uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  ushort uVar6;
  byte bVar7;
  uint uVar8;
  code *pcVar9;
  byte bVar10;
  byte bVar11;
  int iVar12;
  char cVar13;
  ushort uVar14;
  dac_control *chip;
  undefined8 uVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  
  if ((*(byte *)((long)info + 0x7c) & 0x81) == 1) {
    uVar5 = -(uint)*(byte *)((long)info + 0x98);
    if (*(char *)((long)info + 0x7d) == '\0') {
      uVar5 = (uint)*(byte *)((long)info + 0x98);
    }
    uVar17 = (ulong)samples * *(long *)((long)info + 0x80) + *(long *)((long)info + 0x88);
    *(ulong *)((long)info + 0x88) = uVar17 & 0xffffffff;
    uVar8 = *(uint *)((long)info + 0x90);
    uVar16 = (uint)(uVar17 >> 0x20);
    if (uVar8 < uVar16) {
      uVar16 = uVar8;
    }
    *(uint *)((long)info + 0x90) = uVar8 - uVar16;
    if (0x20 < uVar16) {
      *(int *)((long)info + 0x94) = *(int *)((long)info + 0x94) + (uVar16 - 0x10) * uVar5;
      uVar16 = 0x10;
    }
    while (bVar18 = uVar16 != 0, uVar16 = uVar16 - 1, bVar18) {
      uVar8 = *(int *)((long)info + 0x94) + *(int *)((long)info + 0x70);
      if (uVar8 < *(uint *)((long)info + 0x60)) {
        lVar4 = *(long *)((long)info + 0x68);
        uVar17 = (ulong)uVar8;
        cVar13 = *(char *)((long)info + 0x50);
        switch(cVar13) {
        case '\0':
          pcVar9 = *(code **)((long)info + 0x30);
          if (pcVar9 != (code *)0x0) {
            bVar10 = (byte)*(ushort *)((long)info + 0x52) & 0xf0;
            bVar11 = *(byte *)(lVar4 + uVar17) & 0xf;
            if ((*(ushort *)((long)info + 0x52) & 0x10) != 0) {
              uVar15 = *(undefined8 *)((long)info + 8);
              uVar8 = (uint)(bVar11 | bVar10);
LAB_0011d952:
              uVar14 = 0;
              goto LAB_0011d774;
            }
            bVar7 = *(byte *)(lVar4 + uVar17) >> 4 | (*(byte *)(lVar4 + 1 + uVar17) & 3) << 4;
            (*pcVar9)(*(undefined8 *)((long)info + 8),0,bVar11 | bVar10);
            uVar15 = *(undefined8 *)((long)info + 8);
LAB_0011d96c:
            uVar14 = 0;
LAB_0011d720:
            (**(code **)((long)info + 0x30))(uVar15,uVar14,bVar7);
          }
          break;
        case '\x01':
        case '\x03':
        case '\x06':
        case '\t':
        case '\n':
        case '\v':
        case '\x0f':
        case '\x12':
          if (*(code **)((long)info + 0x30) != (code *)0x0) {
            bVar7 = *(byte *)(lVar4 + uVar17);
            (**(code **)((long)info + 0x30))
                      (*(undefined8 *)((long)info + 8),0,*(undefined1 *)((long)info + 0x52));
            uVar15 = *(undefined8 *)((long)info + 8);
            uVar14 = 1;
            goto LAB_0011d720;
          }
          break;
        case '\x02':
        case '\a':
        case '\b':
        case '\f':
        case '\r':
        case '\x0e':
        case '\x19':
          if (*(code **)((long)info + 0x30) != (code *)0x0) {
            bVar7 = *(byte *)(lVar4 + uVar17);
            uVar14 = *(ushort *)((long)info + 0x52) >> 7;
            (**(code **)((long)info + 0x30))
                      (*(undefined8 *)((long)info + 8),uVar14 & 0xfe,
                       (char)*(ushort *)((long)info + 0x52));
            uVar15 = *(undefined8 *)((long)info + 8);
            uVar14 = (ushort)(byte)((byte)uVar14 | 1);
            goto LAB_0011d720;
          }
          break;
        case '\x04':
        case '\x10':
        case '\x15':
        case '%':
          break;
        case '\x05':
        case '\x1b':
          pcVar9 = *(code **)((long)info + 0x30);
          if (pcVar9 != (code *)0x0) {
            uVar2 = *(ushort *)((long)info + 0x52);
            uVar6 = uVar2 >> 8;
            uVar1 = *(undefined1 *)(lVar4 + uVar17);
            if (uVar6 == 0xff) {
              (*pcVar9)(*(undefined8 *)((long)info + 8));
            }
            else {
              bVar7 = (byte)(uVar2 >> 8);
              if (cVar13 == '\x1b') {
                bVar7 = (**(code **)((long)info + 0x10))(*(undefined8 *)((long)info + 8),0);
                pcVar9 = *(code **)((long)info + 0x30);
              }
              uVar14 = uVar2 >> 4 & 0xf;
              (*pcVar9)(*(undefined8 *)((long)info + 8),uVar14,uVar6);
              (**(code **)((long)info + 0x30))(*(undefined8 *)((long)info + 8),uVar2 & 0xf,uVar1);
              if (uVar6 != bVar7) {
                uVar15 = *(undefined8 *)((long)info + 8);
                goto LAB_0011d720;
              }
            }
          }
          break;
        case '\x11':
          pcVar9 = *(code **)((long)info + 0x38);
          if (pcVar9 != (code *)0x0) {
            uVar8 = (uint)*(byte *)(lVar4 + uVar17) | (*(byte *)(lVar4 + 1 + uVar17) & 0xf) << 8;
            uVar15 = *(undefined8 *)((long)info + 8);
            uVar14 = *(ushort *)((long)info + 0x52) & 0xf;
LAB_0011d774:
            (*pcVar9)(uVar15,uVar14,uVar8);
          }
          break;
        case '\x13':
        case '\x14':
        case '\x16':
        case '\x17':
        case '\x1d':
        case '\x1e':
        case '$':
        case '(':
        case ')':
          pcVar9 = *(code **)((long)info + 0x30);
          if (pcVar9 != (code *)0x0) {
            uVar14 = (ushort)*(byte *)((long)info + 0x52);
            uVar8 = (uint)*(byte *)(lVar4 + uVar17);
            uVar15 = *(undefined8 *)((long)info + 8);
            goto LAB_0011d774;
          }
          break;
        case '\x18':
          pcVar9 = *(code **)((long)info + 0x30);
          if (pcVar9 != (code *)0x0) {
            uVar14 = *(ushort *)((long)info + 0x52);
            uVar8 = (uint)*(byte *)(lVar4 + uVar17);
            if ((char)uVar14 == '\0') {
              uVar15 = *(undefined8 *)((long)info + 8);
              cVar13 = (char)(uVar14 >> 8);
              if (-1 < (char)*(byte *)(lVar4 + uVar17)) {
                uVar8 = (byte)(cVar13 << 3) & 0x78;
                goto LAB_0011d952;
              }
              (*pcVar9)(uVar15,0,uVar8);
              uVar15 = *(undefined8 *)((long)info + 8);
              bVar7 = cVar13 << 4;
              goto LAB_0011d96c;
            }
            uVar15 = *(undefined8 *)((long)info + 8);
            uVar14 = uVar14 & 0xff;
            goto LAB_0011d774;
          }
          break;
        case '\x1a':
        case '\x1c':
        case ' ':
        case '\"':
        case '&':
        case '\'':
switchD_0011d69a_caseD_1a:
          pcVar9 = *(code **)((long)info + 0x40);
          if (pcVar9 != (code *)0x0) {
            uVar8 = (uint)*(byte *)(lVar4 + uVar17);
            uVar15 = *(undefined8 *)((long)info + 8);
            uVar14 = *(ushort *)((long)info + 0x52);
            goto LAB_0011d774;
          }
          break;
        case '\x1f':
          if (*(code **)((long)info + 0x30) != (code *)0x0) {
            bVar7 = *(byte *)((long)info + 0x52);
            (**(code **)((long)info + 0x30))
                      (*(undefined8 *)((long)info + 8),0,*(undefined1 *)(lVar4 + uVar17));
            (**(code **)((long)info + 0x30))
                      (*(undefined8 *)((long)info + 8),1,*(undefined1 *)(lVar4 + 1 + uVar17));
            uVar15 = *(undefined8 *)((long)info + 8);
            uVar14 = 2;
            goto LAB_0011d720;
          }
          break;
        case '!':
          pcVar9 = *(code **)((long)info + 0x30);
          if (pcVar9 != (code *)0x0) {
            uVar8 = (uint)*(byte *)(lVar4 + uVar17);
            uVar15 = *(undefined8 *)((long)info + 8);
            uVar14 = (ushort)(byte)(*(char *)((long)info + 0x52) + 0x80);
            goto LAB_0011d774;
          }
          break;
        case '#':
          if (*(code **)((long)info + 0x30) != (code *)0x0) {
            bVar7 = *(byte *)(lVar4 + uVar17);
            (**(code **)((long)info + 0x30))
                      (*(undefined8 *)((long)info + 8),1,*(undefined1 *)((long)info + 0x52));
            uVar15 = *(undefined8 *)((long)info + 8);
            uVar14 = 0;
            goto LAB_0011d720;
          }
          break;
        default:
          if (cVar13 == -0x80) goto switchD_0011d69a_caseD_1a;
        }
      }
      *(int *)((long)info + 0x94) = *(int *)((long)info + 0x94) + uVar5;
    }
    if (*(int *)((long)info + 0x90) == 0) {
      if ((*(byte *)((long)info + 0x7c) & 4) != 0) {
        iVar3 = *(int *)((long)info + 0x78);
        *(int *)((long)info + 0x90) = iVar3;
        if (*(char *)((long)info + 0x7d) == '\0') {
          iVar12 = 0;
        }
        else {
          iVar12 = (uint)*(byte *)((long)info + 0x98) * (iVar3 + -1);
        }
        *(int *)((long)info + 0x94) = iVar12;
        if (iVar3 != 0) {
          return;
        }
      }
      *(byte *)((long)info + 0x7c) = *(byte *)((long)info + 0x7c) & 0xfe;
    }
  }
  return;
}

Assistant:

void daccontrol_update(void* info, UINT32 samples, DEV_SMPL** dummy)
{
	dac_control* chip = (dac_control*)info;
	INT32 RealDataStp;
	UINT32 cmdsToProc;
	
	if (chip->Running & 0x80)	// disabled
		return;
	if (! (chip->Running & 0x01))	// stopped
		return;
	
	RealDataStp = (chip->Reverse) ? -chip->DataStep : +chip->DataStep;
	
	RC_STEPS(&chip->stepCntr, samples);
	cmdsToProc = RC_GET_VAL(&chip->stepCntr);
	RC_MASK(&chip->stepCntr);
	
	if (cmdsToProc > chip->RemainCmds)
		cmdsToProc = chip->RemainCmds;
	chip->RemainCmds -= cmdsToProc;
	
	if (cmdsToProc > 0x20)
	{
		// very effective Speed Hack for fast seeking
		chip->RealPos += RealDataStp * (cmdsToProc - 0x10);
		cmdsToProc = 0x10;
	}
	
	for (; cmdsToProc > 0; cmdsToProc --)
	{
		daccontrol_SendCommand(chip);
		chip->RealPos += RealDataStp;
	}
	
	if (! chip->RemainCmds && (chip->Running & 0x04))
	{
		// loop back to start
		chip->RemainCmds = chip->CmdsToSend;
		if (! chip->Reverse)
			chip->RealPos = 0x00;
		else
			chip->RealPos = (chip->CmdsToSend - 1) * chip->DataStep;
	}
	
	if (! chip->RemainCmds)
		chip->Running &= ~0x01;	// stop
	
	return;
}